

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::Loss::findKBest(Loss *this,int32_t k,real threshold,Predictions *heap,Vector *output)

{
  float fVar1;
  int iVar2;
  pointer pfVar3;
  pointer ppVar4;
  pointer ppVar5;
  bool bVar6;
  pointer pfVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  int local_34;
  float local_30;
  float local_2c;
  
  local_34 = 0;
  pfVar7 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar3 != pfVar7 && -1 < (long)pfVar3 - (long)pfVar7) {
    lVar9 = 0;
    local_30 = threshold;
    do {
      if ((local_30 <= pfVar7[lVar9]) &&
         (((long)(heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start >> 3 != (long)k ||
          (dVar12 = ::log((double)pfVar7[lVar9] + 1e-05),
          ((heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start)->first <= (float)dVar12)))) {
        dVar12 = ::log((double)(output->data_).super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start[local_34] + 1e-05);
        local_2c = (float)dVar12;
        std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
        emplace_back<float,int&>
                  ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,
                   &local_2c,&local_34);
        ppVar4 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        fVar1 = ppVar5[-1].first;
        iVar2 = ppVar5[-1].second;
        uVar8 = (long)ppVar5 - (long)ppVar4 >> 3;
        lVar9 = uVar8 - 1;
        if (1 < (long)uVar8) {
          do {
            lVar10 = (lVar9 + -1) - (lVar9 + -1 >> 0x3f) >> 1;
            if (ppVar4[lVar10].first <= fVar1) break;
            ppVar4[lVar9].first = ppVar4[lVar10].first;
            ppVar4[lVar9].second = ppVar4[lVar10].second;
            bVar6 = 2 < lVar9;
            lVar9 = lVar10;
          } while (bVar6);
        }
        ppVar4[lVar9].first = fVar1;
        ppVar4[lVar9].second = iVar2;
        if ((ulong)(long)k < uVar8) {
          if (8 < (long)ppVar5 - (long)ppVar4) {
            fVar1 = ppVar5[-1].first;
            iVar2 = ppVar5[-1].second;
            ppVar5[-1].first = ppVar4->first;
            ppVar5[-1].second = ppVar4->second;
            uVar8 = (long)(ppVar5 + -1) - (long)ppVar4;
            lVar9 = (long)uVar8 >> 3;
            if (lVar9 < 3) {
              lVar10 = 0;
            }
            else {
              lVar11 = 0;
              do {
                if (ppVar4[lVar11 * 2 + 1].first < ppVar4[lVar11 * 2 + 2].first) {
                  lVar10 = lVar11 * 2 + 1;
                }
                else {
                  lVar10 = lVar11 * 2 + 2;
                }
                ppVar4[lVar11].first = ppVar4[lVar10].first;
                ppVar4[lVar11].second = ppVar4[lVar10].second;
                lVar11 = lVar10;
              } while (lVar10 < (lVar9 + -1) - (lVar9 + -1 >> 0x3f) >> 1);
            }
            if (((uVar8 & 8) == 0) && (lVar10 == lVar9 + -2 >> 1)) {
              ppVar4[lVar10].first = ppVar4[lVar10 * 2 + 1].first;
              ppVar4[lVar10].second = ppVar4[lVar10 * 2 + 1].second;
              lVar10 = lVar10 * 2 + 1;
            }
            if (0 < lVar10) {
              do {
                lVar9 = (lVar10 + -1) - (lVar10 + -1 >> 0x3f) >> 1;
                if (ppVar4[lVar9].first <= fVar1) break;
                ppVar4[lVar10].first = ppVar4[lVar9].first;
                ppVar4[lVar10].second = ppVar4[lVar9].second;
                bVar6 = 2 < lVar10;
                lVar10 = lVar9;
              } while (bVar6);
            }
            ppVar4[lVar10].first = fVar1;
            ppVar4[lVar10].second = iVar2;
          }
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
        }
      }
      lVar9 = (long)local_34 + 1;
      local_34 = (int)lVar9;
      pfVar7 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar9 < (long)(output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)pfVar7 >> 2);
  }
  return;
}

Assistant:

void Loss::findKBest(
    int32_t k,
    real threshold,
    Predictions& heap,
    const Vector& output) const {
  for (int32_t i = 0; i < output.size(); i++) {
    if (output[i] < threshold) {
      continue;
    }
    if (heap.size() == k && std_log(output[i]) < heap.front().first) {
      continue;
    }
    heap.emplace_back(std_log(output[i]), i);
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}